

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::FunctionExp(SQCompiler *this,SQInteger ftype,bool lambda)

{
  SQFuncState *this_00;
  SQInteger arg0;
  SQObjectPtr dummy;
  
  Lex(this);
  Expect(this,0x28);
  dummy.super_SQObject._type = OT_NULL;
  dummy.super_SQObject._unVal.pTable = (SQTable *)0x0;
  CreateFunction(this,&dummy.super_SQObject,lambda);
  this_00 = this->_fs;
  arg0 = SQFuncState::PushTarget(this_00,-1);
  SQFuncState::AddInstruction
            (this_00,_OP_CLOSURE,arg0,(this->_fs->_functions)._size - 1,(ulong)(ftype != 0x11d),0);
  SQObjectPtr::~SQObjectPtr(&dummy);
  return;
}

Assistant:

void FunctionExp(SQInteger ftype,bool lambda = false)
    {
        Lex(); Expect(_SC('('));
        SQObjectPtr dummy;
        CreateFunction(dummy,lambda);
        _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, ftype == TK_FUNCTION?0:1);
    }